

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O2

Vector * GMRESIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType PrecondProc,
                  double OmegaPrecond)

{
  double *pdVar1;
  size_t __size;
  size_t __size_00;
  double dVar2;
  double dVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  LASErrIdType LVar7;
  Boolean BVar8;
  void *__ptr;
  void *pvVar9;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  size_t Dim;
  Vector *__ptr_03;
  Vector *pVVar10;
  Vector *pVVar11;
  Vector *pVVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  double bNorm;
  double dVar18;
  double dVar19;
  int local_c0;
  char vName [10];
  
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  iVar6 = GMRESSteps;
  lVar16 = (long)GMRESSteps;
  __size = lVar16 * 8 + 8;
  __ptr = malloc(__size);
  __size_00 = lVar16 * 8 + 0x10;
  if (__ptr == (void *)0x0) {
    bVar5 = true;
  }
  else {
    uVar17 = (ulong)(uint)iVar6;
    if (iVar6 < 1) {
      uVar17 = 0;
    }
    bVar5 = true;
    for (uVar15 = 0; uVar17 != uVar15; uVar15 = uVar15 + 1) {
      pvVar9 = malloc(__size_00);
      *(void **)((long)__ptr + uVar15 * 8 + 8) = pvVar9;
      if (pvVar9 == (void *)0x0) {
        bVar5 = false;
      }
    }
    bVar5 = !bVar5;
  }
  pvVar9 = malloc(__size);
  __ptr_00 = malloc(__size_00);
  __ptr_01 = malloc(__size);
  __ptr_02 = malloc(__size);
  Dim = Q_GetDim(A);
  uVar17 = (ulong)GMRESSteps;
  __ptr_03 = (Vector *)malloc(uVar17 * 0x30 + 0x60);
  if (__ptr_03 != (Vector *)0x0) {
    pVVar10 = __ptr_03;
    for (lVar16 = 1; pVVar10 = pVVar10 + 1, lVar16 <= (int)uVar17 + 1; lVar16 = lVar16 + 1) {
      sprintf(vName,"v[%d]");
      V_Constr(pVVar10,vName,Dim,Normal,True);
      uVar17 = (ulong)(uint)GMRESSteps;
    }
    if (((__ptr_02 != (void *)0x0 && __ptr_01 != (void *)0x0) &&
        (pvVar9 != (void *)0x0 && __ptr_00 != (void *)0x0)) && !bVar5) goto LAB_0010727e;
  }
  LASError(LASMemAllocErr,"GMRESIter",(char *)0x0,(char *)0x0,(char *)0x0);
LAB_0010727e:
  LVar7 = LASResult();
  if (LVar7 != LASOK) {
LAB_0010729f:
    if (__ptr_03 != (Vector *)0x0) {
      pVVar10 = __ptr_03;
      for (lVar16 = 1; pVVar10 = pVVar10 + 1, lVar16 <= (long)GMRESSteps + 1; lVar16 = lVar16 + 1) {
        V_Destr(pVVar10);
      }
      free(__ptr_03);
    }
    if (__ptr != (void *)0x0) {
      uVar15 = 0;
      uVar17 = (ulong)(uint)GMRESSteps;
      if (GMRESSteps < 1) {
        uVar17 = uVar15;
      }
      for (; uVar17 != uVar15; uVar15 = uVar15 + 1) {
        free(*(void **)((long)__ptr + uVar15 * 8 + 8));
      }
      free(__ptr);
    }
    free(pvVar9);
    free(__ptr_00);
    free(__ptr_01);
    free(__ptr_02);
    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);
    return x;
  }
  bNorm = l2Norm_V(b);
  dVar18 = l1Norm_V(x);
  if (2.2250738585072014e-307 <=
      ABS(dVar18 / (((double)CONCAT44(0x45300000,(int)(Dim >> 0x20)) - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)Dim) - 4503599627370496.0)))) {
    BVar8 = Q_KerDefined(A);
    if (BVar8 != False) {
      OrthoRightKer_VQ(x,A);
    }
    pVVar10 = Mul_QV(A,x);
    pVVar10 = Sub_VV(b,pVVar10);
    Asgn_VV(__ptr_03 + 1,pVVar10);
  }
  else {
    Asgn_VV(__ptr_03 + 1,b);
  }
  pVVar10 = __ptr_03 + 1;
  local_c0 = 0;
LAB_00107445:
  dVar18 = l2Norm_V(pVVar10);
  BVar8 = RTCResult(local_c0,dVar18,bNorm,GMRESIterId);
  if ((BVar8 == False) && (local_c0 < MaxIter)) {
    if (PrecondProc != (PrecondProcType)0x0) {
      (*PrecondProc)(A,pVVar10,pVVar10,OmegaPrecond);
    }
    dVar18 = l2Norm_V(pVVar10);
    *(double *)((long)__ptr_00 + 8) = dVar18;
    MulAsgn_VS(pVVar10,1.0 / dVar18);
    uVar14 = 0;
    do {
      uVar15 = (ulong)uVar14;
      uVar17 = uVar15;
      if (PrecondProc == (PrecondProcType)0x0) {
        BVar8 = RTCResult(local_c0,ABS(*(double *)((long)__ptr_00 + uVar15 * 8 + 8)),bNorm,
                          GMRESIterId);
        if (((BVar8 != False) || (GMRESSteps <= (int)uVar14)) || (MaxIter <= local_c0))
        goto LAB_00107711;
        uVar17 = (ulong)(uVar14 + 1);
        pVVar11 = Mul_QV(A,__ptr_03 + uVar17);
        Asgn_VV(__ptr_03 + uVar15 + 2,pVVar11);
      }
      else {
        if ((GMRESSteps <= (int)uVar14) || (MaxIter <= local_c0)) goto LAB_00107711;
        uVar17 = (ulong)(uVar14 + 1);
        pVVar11 = Mul_QV(A,__ptr_03 + uVar17);
        (*PrecondProc)(A,__ptr_03 + uVar15 + 2,pVVar11,OmegaPrecond);
      }
      pVVar11 = pVVar10;
      for (uVar13 = 1; (uint)uVar17 + 1 != uVar13; uVar13 = uVar13 + 1) {
        dVar18 = Mul_VV(__ptr_03 + uVar15 + 2,pVVar11);
        *(double *)(*(long *)((long)__ptr + uVar17 * 8) + uVar13 * 8) = dVar18;
        pVVar12 = Mul_SV(dVar18,pVVar11);
        SubAsgn_VV(__ptr_03 + uVar15 + 2,pVVar12);
        pVVar11 = pVVar11 + 1;
      }
      lVar16 = uVar15 + 2;
      dVar18 = l2Norm_V(__ptr_03 + lVar16);
      lVar4 = *(long *)((long)__ptr + uVar17 * 8);
      *(double *)(lVar4 + 0x10 + uVar15 * 8) = dVar18;
      MulAsgn_VS(__ptr_03 + lVar16,1.0 / dVar18);
      for (uVar15 = 1; uVar14 + 1 != uVar15; uVar15 = uVar15 + 1) {
        dVar18 = *(double *)((long)__ptr_02 + uVar15 * 8);
        dVar2 = *(double *)((long)__ptr_01 + uVar15 * 8);
        dVar3 = *(double *)(lVar4 + uVar15 * 8);
        dVar19 = *(double *)(lVar4 + 8 + uVar15 * 8);
        pdVar1 = (double *)(lVar4 + uVar15 * 8);
        *pdVar1 = dVar3 * dVar2 + dVar19 * dVar18;
        pdVar1[1] = dVar3 * -dVar18 + dVar19 * dVar2;
      }
      dVar18 = *(double *)(lVar4 + uVar17 * 8);
      dVar2 = *(double *)(lVar4 + lVar16 * 8);
      dVar19 = SQRT(dVar18 * dVar18 + dVar2 * dVar2);
      *(double *)((long)__ptr_01 + uVar17 * 8) = dVar18 / dVar19;
      *(double *)((long)__ptr_02 + uVar17 * 8) = dVar2 / dVar19;
      *(double *)(lVar4 + uVar17 * 8) = dVar19;
      *(undefined8 *)(lVar4 + lVar16 * 8) = 0;
      local_c0 = local_c0 + 1;
      dVar3 = *(double *)((long)__ptr_00 + uVar17 * 8);
      *(double *)((long)__ptr_00 + lVar16 * 8) = -(dVar2 / dVar19) * dVar3;
      *(double *)((long)__ptr_00 + uVar17 * 8) = (dVar18 / dVar19) * dVar3;
      uVar14 = (uint)uVar17;
    } while( true );
  }
  goto LAB_0010729f;
LAB_00107711:
  for (; 0 < (int)uVar17; uVar17 = uVar17 - 1) {
    lVar16 = *(long *)((long)__ptr + uVar17 * 8);
    dVar18 = *(double *)((long)__ptr_00 + uVar17 * 8) / *(double *)(lVar16 + uVar17 * 8);
    *(double *)((long)pvVar9 + uVar17 * 8) = dVar18;
    for (uVar13 = uVar17; 1 < (int)uVar13; uVar13 = uVar13 - 1) {
      *(double *)((long)__ptr_00 + uVar13 * 8 + -8) =
           *(double *)((long)__ptr_00 + uVar13 * 8 + -8) -
           *(double *)(lVar16 + -8 + uVar13 * 8) * dVar18;
    }
  }
  pVVar11 = __ptr_03 + uVar15;
  for (; 0 < (int)uVar15; uVar15 = uVar15 - 1) {
    pVVar12 = Mul_SV(*(double *)((long)pvVar9 + uVar15 * 8),pVVar11);
    AddAsgn_VV(x,pVVar12);
    pVVar11 = pVVar11 + -1;
  }
  BVar8 = Q_KerDefined(A);
  if (BVar8 != False) {
    OrthoRightKer_VQ(x,A);
  }
  pVVar11 = Mul_QV(A,x);
  pVVar11 = Sub_VV(b,pVVar11);
  Asgn_VV(pVVar10,pVVar11);
  goto LAB_00107445;
}

Assistant:

Vector *GMRESIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType PrecondProc, double OmegaPrecond)
{
    /*
     *  for details to the algorithm see
     *
     *  R. Barrett, M. Berry, T. F. Chan, J. Demmel, J. Donato, J. Dongarra,
     *  V. Eijkhout, R. Pozo, Ch. Romine, H. van der Vorst:
     *  Templates for the Solution of Linear Systems: Building Blocks
     *  for Iterative Solvers;
     *  SIAM, Philadelphia, 1994
     *
     */

    char vName[10];
    int Iter, i, j, k;
    double h1, h2, r;
    double bNorm;
    double **h, *y, *s, *c1, *c2;
    size_t Dim;
    Boolean AllocOK;
    Vector *v;

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    /* allocation of matrix H and vectors y, s, c1 and c2 */
    AllocOK = True;
    h = (double **)malloc((GMRESSteps + 1) * sizeof(double *));
    if (h == NULL) {
        AllocOK = False;
    } else {
        for (i = 1; i <= GMRESSteps; i++) {
            h[i] = (double *)malloc((GMRESSteps + 2) * sizeof(double));
            if (h[i] == NULL)
                AllocOK = False;
	}
    }
    y = (double *)malloc((GMRESSteps + 1) * sizeof(double));
    if (y == NULL)
        AllocOK = False;
    s = (double *)malloc((GMRESSteps + 2) * sizeof(double));
    if (s == NULL)
        AllocOK = False;
    c1 = (double *)malloc((GMRESSteps + 1) * sizeof(double));
    if (c1 == NULL)
        AllocOK = False;
    c2 = (double *)malloc((GMRESSteps + 1) * sizeof(double));
    if (c2 == NULL)
        AllocOK = False;

    /* ... and vectors u */    
    Dim = Q_GetDim(A);
    v = (Vector *)malloc((GMRESSteps + 2) * sizeof(Vector));
    if (v == NULL)
        AllocOK = False;
    else
        for (i = 1; i <= GMRESSteps + 1; i++) {
	    sprintf(vName, "v[%d]", i % 1000);
            V_Constr(&v[i], vName, Dim, Normal, True);
	}

    if (!AllocOK)
        LASError(LASMemAllocErr, "GMRESIter", NULL, NULL, NULL);
        
    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);

        /* loop for 'MaxIter' GMRES cycles */
        Iter = 0;
        /* v[1] = r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&v[1], Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&v[1], b);
	}
        while (!RTCResult(Iter, l2Norm_V(&v[1]), bNorm, GMRESIterId)
            && Iter < MaxIter) {
            if (PrecondProc != NULL)
	        (*PrecondProc)(A, &v[1], &v[1], OmegaPrecond);
            s[1] = l2Norm_V(&v[1]);
            MulAsgn_VS(&v[1], 1.0 / s[1]);

            /* GMRES iteration */
            i = 0;
            while ((PrecondProc != NULL ? True : !RTCResult(Iter, fabs(s[i+1]),
                bNorm, GMRESIterId)) && i < GMRESSteps && Iter < MaxIter) {
 	        i++;
		Iter++;
                /* w = v[i+1] */
                if (PrecondProc != NULL) 
		    (*PrecondProc)(A, &v[i+1], Mul_QV(A, &v[i]), OmegaPrecond);
                else
                    Asgn_VV(&v[i+1], Mul_QV(A, &v[i]));

                /* modified Gram-Schmidt orthogonalization */
                for (k = 1; k <= i; k++) {
                    h[i][k] = Mul_VV(&v[i+1], &v[k]);
                    SubAsgn_VV(&v[i+1], Mul_SV(h[i][k], &v[k]));
                }

                h[i][i+1] = l2Norm_V(&v[i+1]);
                MulAsgn_VS(&v[i+1], 1.0 / h[i][i+1]);

                /* Q-R algorithm */
                for (k = 1; k < i; k++) {
                    h1 = c1[k] * h[i][k] + c2[k] * h[i][k+1];
                    h2 = - c2[k] * h[i][k] + c1[k] * h[i][k+1];
                    h[i][k] = h1;
                    h[i][k+1] = h2;
                }
                r = sqrt(h[i][i] * h[i][i] + h[i][i+1] * h[i][i+1]);
                c1[i] = h[i][i] / r;
                c2[i] = h[i][i+1] / r;
                h[i][i] = r;
                h[i][i+1] = 0.0;
                s[i+1] = - c2[i] * s[i];
                s[i] = c1[i] * s[i];
            }

            /* Solving of the system of equations : H y = s */
            for (j = i; j > 0; j--) {
                y[j] = s[j] / h[j][j];
                for (k = j - 1; k > 0; k--)
                    s[k] -= h[j][k] * y[j];
            }

            /* updating solution */
            for (j = i; j > 0; j--)
                AddAsgn_VV(x, Mul_SV(y[j], &v[j]));
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
                
            /* computing new residual */
            Asgn_VV(&v[1], Sub_VV(b, Mul_QV(A, x)));
        }
    }

    /* release of vectors u, matrix H and vectors y, s, c1 and c2 */
    if (v != NULL) {
        for (i = 1; i <= GMRESSteps + 1; i++)
            V_Destr(&v[i]);
        free(v);
    }

    if (h != NULL) {
        for (i = 1; i <= GMRESSteps; i++)
	    if (h[i] != NULL)
                free(h[i]);
        free(h);
    }
    if (y != NULL)
        free(y);
    if (s != NULL)
        free(s);
    if (c1 != NULL)
        free(c1);
    if (c2 != NULL)
        free(c2);

    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}